

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O3

bool XmlRpc::XmlRpcUtil::nextTagIs(char *tag,string *xml,int *offset)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *__s1;
  
  iVar5 = *offset;
  if (iVar5 < (int)xml->_M_string_length) {
    pcVar2 = (xml->_M_dataplus)._M_p;
    cVar1 = pcVar2[iVar5];
    if (cVar1 != '\0') {
      __s1 = pcVar2 + iVar5;
      do {
        iVar3 = isspace((int)cVar1);
        if (iVar3 == 0) {
          sVar4 = strlen(tag);
          iVar3 = strncmp(__s1,tag,(long)(int)sVar4);
          if (iVar3 != 0) {
            return false;
          }
          *offset = (int)sVar4 + iVar5;
          return true;
        }
        cVar1 = __s1[1];
        __s1 = __s1 + 1;
        iVar5 = iVar5 + 1;
      } while (cVar1 != '\0');
    }
  }
  return false;
}

Assistant:

bool 
XmlRpcUtil::nextTagIs(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return false;
  const char* cp = xml.c_str() + *offset;
  int nc = 0;
  while (*cp && isspace(*cp)) {
    ++cp;
    ++nc;
  }

  int len = int(strlen(tag));
  if  (*cp && (strncmp(cp, tag, len) == 0)) {
    *offset += nc + len;
    return true;
  }
  return false;
}